

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int Ifn_ManSatCheckOne(sat_solver *pSat,Vec_Int_t *vPoVars,word *pTruth,int nVars,int *pPerm,
                      int nInps,Vec_Int_t *vLits)

{
  int iVar1;
  int Var;
  int *begin;
  int *piVar2;
  uint local_44;
  int nMints;
  int mNew;
  int m;
  int Value;
  int v;
  int nInps_local;
  int *pPerm_local;
  int nVars_local;
  word *pTruth_local;
  Vec_Int_t *vPoVars_local;
  sat_solver *pSat_local;
  
  iVar1 = Vec_IntSize(vPoVars);
  if (1 << ((byte)nInps & 0x1f) != iVar1) {
    __assert_fail("(1 << nInps) == Vec_IntSize(vPoVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x299,
                  "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
                 );
  }
  if (nInps < nVars) {
    __assert_fail("nVars <= nInps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x29a,
                  "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
                 );
  }
  iVar1 = Vec_IntSize(vPoVars);
  Vec_IntFill(vLits,iVar1,-1);
  nMints = 0;
  while( true ) {
    if (1 << ((byte)nVars & 0x1f) <= nMints) {
      m = 0;
      for (nMints = 0; iVar1 = Vec_IntSize(vLits), nMints < iVar1; nMints = nMints + 1) {
        iVar1 = Vec_IntEntry(vLits,nMints);
        if (-1 < iVar1) {
          Var = Vec_IntEntry(vPoVars,nMints);
          iVar1 = Abc_Var2Lit(Var,(uint)((iVar1 != 0 ^ 0xffU) & 1));
          Vec_IntWriteEntry(vLits,m,iVar1);
          m = m + 1;
        }
      }
      Vec_IntShrink(vLits,m);
      begin = Vec_IntArray(vLits);
      piVar2 = Vec_IntArray(vLits);
      iVar1 = Vec_IntSize(vLits);
      iVar1 = sat_solver_solve(pSat,begin,piVar2 + iVar1,0,0,0,0);
      return (int)(iVar1 == 1);
    }
    local_44 = 0;
    for (m = 0; m < nInps; m = m + 1) {
      if (nVars <= pPerm[m]) {
        __assert_fail("pPerm[v] < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x2a2,
                      "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
                     );
      }
      if ((nMints >> ((byte)pPerm[m] & 0x1f) & 1U) != 0) {
        local_44 = 1 << ((byte)m & 0x1f) | local_44;
      }
    }
    iVar1 = Vec_IntEntry(vLits,local_44);
    if (iVar1 != -1) break;
    iVar1 = Abc_TtGetBit(pTruth,nMints);
    Vec_IntWriteEntry(vLits,local_44,iVar1);
    nMints = nMints + 1;
  }
  __assert_fail("Vec_IntEntry(vLits, mNew) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                ,0x2a6,
                "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
               );
}

Assistant:

int Ifn_ManSatCheckOne( sat_solver * pSat, Vec_Int_t * vPoVars, word * pTruth, int nVars, int * pPerm, int nInps, Vec_Int_t * vLits )
{
    int v, Value, m, mNew, nMints = (1 << nVars); // (1 << nInps);
    assert( (1 << nInps) == Vec_IntSize(vPoVars) );
    assert( nVars <= nInps );
    // remap minterms
    Vec_IntFill( vLits, Vec_IntSize(vPoVars), -1 );
    for ( m = 0; m < nMints; m++ )
    {
        mNew = 0;
        for ( v = 0; v < nInps; v++ )
        {
            assert( pPerm[v] < nVars );
            if ( ((m >> pPerm[v]) & 1) )
                mNew |= (1 << v);
        }
        assert( Vec_IntEntry(vLits, mNew) == -1 );
        Vec_IntWriteEntry( vLits, mNew, Abc_TtGetBit(pTruth, m) );
    }
    // find assumptions
    v = 0;
    Vec_IntForEachEntry( vLits, Value, m )
        if ( Value >= 0 )
            Vec_IntWriteEntry( vLits, v++, Abc_Var2Lit(Vec_IntEntry(vPoVars, m), !Value) );
    Vec_IntShrink( vLits, v );
    // run SAT solver
    Value = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
    return (int)(Value == l_True);
}